

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void SerializeToVector<DataStream,CTxOut>(DataStream *s,CTxOut *args)

{
  long in_FS_OFFSET;
  SizeComputer sizecomp;
  uint64_t local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  CTxOut::SerializationOps<SizeComputer,CTxOut_const,ActionSerialize>(args,&local_28);
  WriteCompactSize<DataStream>(s,local_28);
  CTxOut::SerializationOps<DataStream,CTxOut_const,ActionSerialize>(args,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}